

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O0

wchar_t read_decryption_header(archive_read *a)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  uint16_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  void *pvVar7;
  void *pvVar8;
  uint ts;
  uint remaining_size;
  char *p;
  zip *zip;
  archive_read *a_local;
  
  pvVar3 = a->format->data;
  pvVar7 = __archive_read_ahead(a,2,(ssize_t *)0x0);
  if (pvVar7 == (void *)0x0) goto LAB_002c8704;
  uVar1 = *(uint *)((long)pvVar3 + 0x1f9c);
  uVar4 = archive_le16dec(pvVar7);
  *(uint *)((long)pvVar3 + 0x1f9c) = (uint)uVar4;
  __archive_read_consume(a,2);
  if (uVar1 < *(uint *)((long)pvVar3 + 0x1f9c)) {
    free(*(void **)((long)pvVar3 + 0x1fb8));
    *(undefined8 *)((long)pvVar3 + 0x1fb8) = 0;
  }
  pvVar7 = __archive_read_ahead(a,(ulong)*(uint *)((long)pvVar3 + 0x1f9c),(ssize_t *)0x0);
  if (pvVar7 == (void *)0x0) goto LAB_002c8704;
  if (*(long *)((long)pvVar3 + 0x1fb8) == 0) {
    pvVar8 = malloc((ulong)*(uint *)((long)pvVar3 + 0x1f9c));
    *(void **)((long)pvVar3 + 0x1fb8) = pvVar8;
    if (*(long *)((long)pvVar3 + 0x1fb8) == 0) goto LAB_002c8744;
  }
  memcpy(*(void **)((long)pvVar3 + 0x1fb8),pvVar7,(ulong)*(uint *)((long)pvVar3 + 0x1f9c));
  __archive_read_consume(a,(ulong)*(uint *)((long)pvVar3 + 0x1f9c));
  pvVar7 = __archive_read_ahead(a,0xe,(ssize_t *)0x0);
  if (pvVar7 == (void *)0x0) goto LAB_002c8704;
  uVar5 = archive_le32dec(pvVar7);
  if ((0xf < uVar5) && (uVar5 < 0x40001)) {
    uVar4 = archive_le16dec((void *)((long)pvVar7 + 4));
    if (uVar4 != 3) {
      uVar4 = archive_le16dec((void *)((long)pvVar7 + 4));
      archive_set_error(&a->archive,0x54,"Unsupported encryption format version: %u",(ulong)uVar4);
      return L'\xffffffe7';
    }
    uVar4 = archive_le16dec((void *)((long)pvVar7 + 6));
    *(uint *)((long)pvVar3 + 0x1fa0) = (uint)uVar4;
    iVar2 = *(int *)((long)pvVar3 + 0x1fa0);
    if ((((2 < iVar2 - 0x6601U) && (iVar2 != 0x6609)) && (2 < iVar2 - 0x660eU)) &&
       (((iVar2 != 0x6702 && (1 < iVar2 - 0x6720U)) && (iVar2 != 0x6801)))) {
      archive_set_error(&a->archive,0x54,"Unknown encryption algorithm: %u",
                        (ulong)*(uint *)((long)pvVar3 + 0x1fa0));
      return L'\xffffffe7';
    }
    uVar4 = archive_le16dec((void *)((long)pvVar7 + 8));
    *(uint *)((long)pvVar3 + 0x1fa4) = (uint)uVar4;
    uVar4 = archive_le16dec((void *)((long)pvVar7 + 10));
    *(uint *)((long)pvVar3 + 0x1fa8) = (uint)uVar4;
    if (2 < (*(uint *)((long)pvVar3 + 0x1fa8) & 0xf000) - 1) {
      archive_set_error(&a->archive,0x54,"Unknown encryption flag: %u",
                        (ulong)*(uint *)((long)pvVar3 + 0x1fa8));
      return L'\xffffffe7';
    }
    if (((*(uint *)((long)pvVar3 + 0x1fa8) & 0xf000) == 0) ||
       ((*(uint *)((long)pvVar3 + 0x1fa8) & 0xf000) == 0x4000)) {
      archive_set_error(&a->archive,0x54,"Unknown encryption flag: %u",
                        (ulong)*(uint *)((long)pvVar3 + 0x1fa8));
      return L'\xffffffe7';
    }
    uVar1 = *(uint *)((long)pvVar3 + 0x1fac);
    uVar4 = archive_le16dec((void *)((long)pvVar7 + 0xc));
    *(uint *)((long)pvVar3 + 0x1fac) = (uint)uVar4;
    __archive_read_consume(a,0xe);
    if ((((*(uint *)((long)pvVar3 + 0x1fac) & 0xf) != 0) ||
        (uVar5 < *(int *)((long)pvVar3 + 0x1fac) + 0x10U)) ||
       (*(int *)((long)pvVar3 + 0x1fac) + 0x10U < *(uint *)((long)pvVar3 + 0x1fac)))
    goto LAB_002c8724;
    if (uVar1 < *(uint *)((long)pvVar3 + 0x1fac)) {
      free(*(void **)((long)pvVar3 + 0x1fc0));
      *(undefined8 *)((long)pvVar3 + 0x1fc0) = 0;
    }
    pvVar7 = __archive_read_ahead(a,(ulong)*(uint *)((long)pvVar3 + 0x1fac),(ssize_t *)0x0);
    if (pvVar7 == (void *)0x0) goto LAB_002c8704;
    if (*(long *)((long)pvVar3 + 0x1fc0) == 0) {
      pvVar8 = malloc((ulong)*(uint *)((long)pvVar3 + 0x1fac));
      *(void **)((long)pvVar3 + 0x1fc0) = pvVar8;
      if (*(long *)((long)pvVar3 + 0x1fc0) == 0) goto LAB_002c8744;
    }
    memcpy(*(void **)((long)pvVar3 + 0x1fc0),pvVar7,(ulong)*(uint *)((long)pvVar3 + 0x1fac));
    __archive_read_consume(a,(ulong)*(uint *)((long)pvVar3 + 0x1fac));
    pvVar7 = __archive_read_ahead(a,4,(ssize_t *)0x0);
    if (pvVar7 != (void *)0x0) {
      uVar6 = archive_le32dec(pvVar7);
      if (uVar6 != 0) goto LAB_002c8724;
      __archive_read_consume(a,4);
      pvVar7 = __archive_read_ahead(a,2,(ssize_t *)0x0);
      if (pvVar7 != (void *)0x0) {
        uVar1 = *(uint *)((long)pvVar3 + 0x1fb0);
        uVar4 = archive_le16dec(pvVar7);
        *(uint *)((long)pvVar3 + 0x1fb0) = (uint)uVar4;
        __archive_read_consume(a,2);
        if ((((*(uint *)((long)pvVar3 + 0x1fb0) & 0xf) != 0) ||
            (uVar5 < *(int *)((long)pvVar3 + 0x1fac) + *(int *)((long)pvVar3 + 0x1fb0) + 0x10U)) ||
           (*(int *)((long)pvVar3 + 0x1fac) + *(int *)((long)pvVar3 + 0x1fb0) + 0x10U <
            (uint)(*(int *)((long)pvVar3 + 0x1fac) + *(int *)((long)pvVar3 + 0x1fb0))))
        goto LAB_002c8724;
        if (uVar1 < *(uint *)((long)pvVar3 + 0x1fb0)) {
          free(*(void **)((long)pvVar3 + 0x1fc8));
          *(undefined8 *)((long)pvVar3 + 0x1fc8) = 0;
        }
        pvVar7 = __archive_read_ahead(a,(ulong)*(uint *)((long)pvVar3 + 0x1fb0),(ssize_t *)0x0);
        if (pvVar7 != (void *)0x0) {
          if (*(long *)((long)pvVar3 + 0x1fc8) == 0) {
            pvVar8 = malloc((ulong)*(uint *)((long)pvVar3 + 0x1fb0));
            *(void **)((long)pvVar3 + 0x1fc8) = pvVar8;
            if (*(long *)((long)pvVar3 + 0x1fc8) == 0) {
LAB_002c8744:
              archive_set_error(&a->archive,0xc,"No memory for ZIP decryption");
              return L'\xffffffe2';
            }
          }
          memcpy(*(void **)((long)pvVar3 + 0x1fc8),pvVar7,(ulong)*(uint *)((long)pvVar3 + 0x1fb0));
          __archive_read_consume(a,(ulong)*(uint *)((long)pvVar3 + 0x1fb0));
          pvVar7 = __archive_read_ahead(a,4,(ssize_t *)0x0);
          if (pvVar7 != (void *)0x0) {
            uVar5 = archive_le32dec(pvVar7);
            *(uint32_t *)((long)pvVar3 + 0x1fb4) = uVar5;
            __archive_read_consume(a,4);
            archive_set_error(&a->archive,0x54,"Encrypted file is unsupported");
            return L'\xffffffe7';
          }
        }
      }
    }
LAB_002c8704:
    archive_set_error(&a->archive,0x54,"Truncated ZIP file data");
    return L'\xffffffe2';
  }
LAB_002c8724:
  archive_set_error(&a->archive,0x54,"Corrupted ZIP file data");
  return L'\xffffffe2';
}

Assistant:

static int
read_decryption_header(struct archive_read *a)
{
	struct zip *zip = (struct zip *)(a->format->data);
	const char *p;
	unsigned int remaining_size;
	unsigned int ts;

	/*
	 * Read an initialization vector data field.
	 */
	p = __archive_read_ahead(a, 2, NULL);
	if (p == NULL)
		goto truncated;
	ts = zip->iv_size;
	zip->iv_size = archive_le16dec(p);
	__archive_read_consume(a, 2);
	if (ts < zip->iv_size) {
		free(zip->iv);
		zip->iv = NULL;
	}
	p = __archive_read_ahead(a, zip->iv_size, NULL);
	if (p == NULL)
		goto truncated;
	if (zip->iv == NULL) {
		zip->iv = malloc(zip->iv_size);
		if (zip->iv == NULL)
			goto nomem;
	}
	memcpy(zip->iv, p, zip->iv_size);
	__archive_read_consume(a, zip->iv_size);

	/*
	 * Read a size of remaining decryption header field.
	 */
	p = __archive_read_ahead(a, 14, NULL);
	if (p == NULL)
		goto truncated;
	remaining_size = archive_le32dec(p);
	if (remaining_size < 16 || remaining_size > (1 << 18))
		goto corrupted;

	/* Check if format version is supported. */
	if (archive_le16dec(p+4) != 3) {
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Unsupported encryption format version: %u",
		    archive_le16dec(p+4));
		return (ARCHIVE_FAILED);
	}

	/*
	 * Read an encryption algorithm field.
	 */
	zip->alg_id = archive_le16dec(p+6);
	switch (zip->alg_id) {
	case 0x6601:/* DES */
	case 0x6602:/* RC2 */
	case 0x6603:/* 3DES 168 */
	case 0x6609:/* 3DES 112 */
	case 0x660E:/* AES 128 */
	case 0x660F:/* AES 192 */
	case 0x6610:/* AES 256 */
	case 0x6702:/* RC2 (version >= 5.2) */
	case 0x6720:/* Blowfish */
	case 0x6721:/* Twofish */
	case 0x6801:/* RC4 */
		/* Supported encryption algorithm. */
		break;
	default:
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Unknown encryption algorithm: %u", zip->alg_id);
		return (ARCHIVE_FAILED);
	}

	/*
	 * Read a bit length field.
	 */
	zip->bit_len = archive_le16dec(p+8);

	/*
	 * Read a flags field.
	 */
	zip->flags = archive_le16dec(p+10);
	switch (zip->flags & 0xf000) {
	case 0x0001: /* Password is required to decrypt. */
	case 0x0002: /* Certificates only. */
	case 0x0003: /* Password or certificate required to decrypt. */
		break;
	default:
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Unknown encryption flag: %u", zip->flags);
		return (ARCHIVE_FAILED);
	}
	if ((zip->flags & 0xf000) == 0 ||
	    (zip->flags & 0xf000) == 0x4000) {
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Unknown encryption flag: %u", zip->flags);
		return (ARCHIVE_FAILED);
	}

	/*
	 * Read an encrypted random data field.
	 */
	ts = zip->erd_size;
	zip->erd_size = archive_le16dec(p+12);
	__archive_read_consume(a, 14);
	if ((zip->erd_size & 0xf) != 0 ||
	    (zip->erd_size + 16) > remaining_size ||
	    (zip->erd_size + 16) < zip->erd_size)
		goto corrupted;

	if (ts < zip->erd_size) {
		free(zip->erd);
		zip->erd = NULL;
	}
	p = __archive_read_ahead(a, zip->erd_size, NULL);
	if (p == NULL)
		goto truncated;
	if (zip->erd == NULL) {
		zip->erd = malloc(zip->erd_size);
		if (zip->erd == NULL)
			goto nomem;
	}
	memcpy(zip->erd, p, zip->erd_size);
	__archive_read_consume(a, zip->erd_size);

	/*
	 * Read a reserved data field.
	 */
	p = __archive_read_ahead(a, 4, NULL);
	if (p == NULL)
		goto truncated;
	/* Reserved data size should be zero. */
	if (archive_le32dec(p) != 0)
		goto corrupted;
	__archive_read_consume(a, 4);

	/*
	 * Read a password validation data field.
	 */
	p = __archive_read_ahead(a, 2, NULL);
	if (p == NULL)
		goto truncated;
	ts = zip->v_size;
	zip->v_size = archive_le16dec(p);
	__archive_read_consume(a, 2);
	if ((zip->v_size & 0x0f) != 0 ||
	    (zip->erd_size + zip->v_size + 16) > remaining_size ||
	    (zip->erd_size + zip->v_size + 16) < (zip->erd_size + zip->v_size))
		goto corrupted;
	if (ts < zip->v_size) {
		free(zip->v_data);
		zip->v_data = NULL;
	}
	p = __archive_read_ahead(a, zip->v_size, NULL);
	if (p == NULL)
		goto truncated;
	if (zip->v_data == NULL) {
		zip->v_data = malloc(zip->v_size);
		if (zip->v_data == NULL)
			goto nomem;
	}
	memcpy(zip->v_data, p, zip->v_size);
	__archive_read_consume(a, zip->v_size);

	p = __archive_read_ahead(a, 4, NULL);
	if (p == NULL)
		goto truncated;
	zip->v_crc32 = archive_le32dec(p);
	__archive_read_consume(a, 4);

	/*return (ARCHIVE_OK);
	 * This is not fully implemented yet.*/
	archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
	    "Encrypted file is unsupported");
	return (ARCHIVE_FAILED);
truncated:
	archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
	    "Truncated ZIP file data");
	return (ARCHIVE_FATAL);
corrupted:
	archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
	    "Corrupted ZIP file data");
	return (ARCHIVE_FATAL);
nomem:
	archive_set_error(&a->archive, ENOMEM,
	    "No memory for ZIP decryption");
	return (ARCHIVE_FATAL);
}